

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlBase64.c
# Opt level: O3

JL_STATUS JlBase64Encode(void *Data,size_t DataSize,char **pBase64String)

{
  JL_STATUS JVar1;
  char *pcVar2;
  long lVar3;
  uint8_t *ThreeByteBlock;
  void *__src;
  ulong uVar4;
  ulong __n;
  byte local_4b [3];
  char **local_48;
  long local_40;
  char local_34;
  char local_33;
  char local_32;
  char local_31;
  
  JVar1 = JL_STATUS_INVALID_PARAMETER;
  if (pBase64String != (char **)0x0 && (DataSize != 0 && Data != (void *)0x0)) {
    *pBase64String = (char *)0x0;
    uVar4 = DataSize / 3;
    local_40 = uVar4 * 3;
    __n = DataSize % 3;
    lVar3 = DataSize + 1 + uVar4 * -3;
    if (__n == 0) {
      lVar3 = 0;
    }
    pcVar2 = (char *)WjTestLib_Calloc(lVar3 + uVar4 * 4 + 1,1);
    if (pcVar2 == (char *)0x0) {
      JVar1 = JL_STATUS_OUT_OF_MEMORY;
    }
    else {
      lVar3 = 0;
      ThreeByteBlock = (uint8_t *)Data;
      local_48 = pBase64String;
      if (2 < DataSize) {
        do {
          Encode3BytesToBase64(ThreeByteBlock,pcVar2 + lVar3);
          lVar3 = lVar3 + 4;
          uVar4 = uVar4 - 1;
          ThreeByteBlock = ThreeByteBlock + 3;
        } while (uVar4 != 0);
      }
      if (__n != 0) {
        __src = (void *)((long)Data + local_40);
        memset(local_4b + __n,0,__n ^ 3);
        memcpy(local_4b,__src,__n);
        local_34 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                   [local_4b[0] >> 2];
        local_33 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                   [(uint)(local_4b[1] >> 4) | (local_4b[0] & 3) << 4];
        local_32 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                   [(uint)(local_4b[2] >> 6) + (local_4b[1] & 0xf) * 4];
        local_31 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                   [local_4b[2] & 0x3f];
        memcpy(pcVar2 + lVar3,&local_34,__n + 1);
      }
      *local_48 = pcVar2;
      JVar1 = JL_STATUS_SUCCESS;
    }
  }
  return JVar1;
}

Assistant:

JL_STATUS
    JlBase64Encode
    (
        void const*         Data,
        size_t              DataSize,
        char**              pBase64String
    )
{
    JL_STATUS jlStatus;

    if(     NULL != Data
        &&  0 != DataSize
        &&  NULL != pBase64String )
    {
        uint8_t const* dataBytes = Data;
        *pBase64String = NULL;

        size_t numCompleteBlocks = DataSize / 3;
        size_t numTrailingBytes = DataSize % 3;
        size_t numExtraChars = 0;

        // Calculate size of string needed
        size_t stringLength = numCompleteBlocks * 4;
        if( numTrailingBytes > 0 )
        {
            numExtraChars = numTrailingBytes + 1;
            stringLength += numExtraChars;
        }

        // Allocate string (one larger for the zero terminator)
        char* string = JlAlloc( stringLength + 1 );
        if( NULL != string )
        {
            // Process in blocks of 3 input bytes at a time
            size_t outIndex = 0;
            for( size_t blockIndex=0; blockIndex<numCompleteBlocks; blockIndex+=1 )
            {
                Encode3BytesToBase64( dataBytes + (blockIndex*3), string + outIndex );
                outIndex += 4;
            }

            if( numTrailingBytes > 0 )
            {
                // Process the final partial block
                uint8_t byteBlock[3] = {0};
                char charBlock[4] = {0};
                for( size_t i=0; i<numTrailingBytes; i++ )
                {
                    byteBlock[i] = dataBytes[ (numCompleteBlocks*3) + i ];
                }
                Encode3BytesToBase64( byteBlock, charBlock );

                // Now copy out the required number of characters
                for( size_t i=0; i<numExtraChars; i++ )
                {
                    string[outIndex] = charBlock[i];
                    outIndex += 1;
                }
            }

            *pBase64String = string;

            jlStatus = JL_STATUS_SUCCESS;
        }
        else
        {
            jlStatus = JL_STATUS_OUT_OF_MEMORY;
        }
    }
    else
    {
        jlStatus = JL_STATUS_INVALID_PARAMETER;
    }

    return jlStatus;
}